

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall
gmath::PinholeCamera::reconstructRay(PinholeCamera *this,Vector3d *V,Vector3d *C,Vector2d *p)

{
  Vector3d Pc;
  SVector<double,_3> SStack_58;
  SVector<double,_3> local_40;
  
  SVector<double,_3>::SVector(&local_40);
  reconstructLocal(this,&local_40,p);
  SMatrix<double,_3,_3>::operator*(&SStack_58,&(this->super_Camera).R,&local_40);
  SVector<double,_3>::operator=(V,&SStack_58);
  SVector<double,_3>::operator=(C,&(this->super_Camera).T);
  return;
}

Assistant:

void PinholeCamera::reconstructRay(Vector3d &V, Vector3d &C, const Vector2d &p) const
{
  Vector3d Pc;
  reconstructLocal(Pc, p);

  V=getR()*Pc;
  C=getT();
}